

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestT<signed_char>(void)

{
  ComparisonTestTU<signed_char,char>();
  ComparisonTestTU<signed_char,signed_char>();
  ComparisonTestTU<signed_char,unsigned_char>();
  ComparisonTestTU<signed_char,short>();
  ComparisonTestTU<signed_char,unsigned_short>();
  ComparisonTestTU<signed_char,int>();
  ComparisonTestTU<signed_char,unsigned_int>();
  ComparisonTestTU<signed_char,long>();
  ComparisonTestTU<signed_char,unsigned_long>();
  ComparisonTestTU<signed_char,long_long>();
  ComparisonTestTU<signed_char,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}